

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_tree.cpp
# Opt level: O0

FollowPos * __thiscall
RegexTree::get_followpos(FollowPos *__return_storage_ptr__,RegexTree *this,StateMap *mp)

{
  size_type sVar1;
  allocator<std::vector<int,_std::allocator<int>_>_> local_59;
  vector<int,_std::allocator<int>_> local_58;
  undefined1 local_38 [8];
  FollowPos ret;
  StateMap *mp_local;
  RegexTree *this_local;
  
  ret.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)mp;
  sVar1 = std::
          unordered_map<const_tree_node_*,_int,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<std::pair<const_tree_node_*const,_int>_>_>
          ::size(mp);
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector(&local_58);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator(&local_59);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_38,sVar1 + 1,&local_58,&local_59);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator(&local_59);
  std::vector<int,_std::allocator<int>_>::~vector(&local_58);
  generate_followpos((StateMap *)
                     ret.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,(FollowPos *)local_38,
                     this->root);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(__return_storage_ptr__,
           (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_38);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)local_38);
  return __return_storage_ptr__;
}

Assistant:

RegexTree::FollowPos RegexTree::get_followpos(const StateMap &mp) const {
    FollowPos ret(mp.size() + 1, std::vector<int>());
    generate_followpos(mp, ret, root);
    return std::move(ret);
}